

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void help(TidyDoc tdoc,ctmbstr prog)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  size_t sVar4;
  tmbstr __ptr;
  ulong local_50;
  tmbstr ptStack_20;
  uint width;
  tmbstr temp_string;
  ctmbstr prog_local;
  TidyDoc tdoc_local;
  
  ptVar1 = tidyLocalizedString(0x353);
  ptVar2 = get_final_name(prog);
  ptVar3 = tidyLibraryVersion();
  printf(ptVar1,ptVar2,ptVar3);
  printf(anon_var_dwarf_13102 + 0x15d);
  ptVar1 = tidyPlatform();
  if (ptVar1 == (ctmbstr)0x0) {
    ptVar1 = tidyLocalizedString(0x355);
    ptStack_20 = stringWithFormat(ptVar1);
  }
  else {
    ptVar1 = tidyLocalizedString(0x354);
    ptVar2 = tidyPlatform();
    ptStack_20 = stringWithFormat(ptVar1,ptVar2);
  }
  sVar4 = strlen(ptStack_20);
  if (sVar4 < 0x4f) {
    local_50 = strlen(ptStack_20);
  }
  else {
    local_50 = 0x4e;
  }
  printf("%s\n",ptStack_20);
  printf("%*.*s\n\n",local_50 & 0xffffffff,local_50 & 0xffffffff,
         "=================================================================");
  free(ptStack_20);
  print_help_options(tdoc);
  printf(anon_var_dwarf_13102 + 0x15d);
  ptVar1 = tidyLocalizedString(0x357);
  __ptr = stringWithFormat(ptVar1,"/etc/tidy.conf","~/.tidyrc");
  ptVar1 = tidyLocalizedString(0x356);
  printf(ptVar1,__ptr);
  free(__ptr);
  printf(anon_var_dwarf_13102 + 0x15d);
  return;
}

Assistant:

static void help(TidyDoc tdoc, /**< The tidy document for which help is showing. */
                 ctmbstr prog  /**< The path of the current executable. */
                 )
{
    tmbstr temp_string = NULL;
    uint width = 78;

    printf( tidyLocalizedString(TC_TXT_HELP_1), get_final_name(prog), tidyLibraryVersion() );
    printf("\n");

    if ( tidyPlatform() )
        temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_2A), tidyPlatform() );
    else
        temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_2B) );

    width = width < strlen(temp_string) ? width : strlen(temp_string);
    printf( "%s\n", temp_string );
    printf( "%*.*s\n\n", width, width, ul);
    free( temp_string );

    print_help_options( tdoc );


    printf("\n");
#if defined(TIDY_CONFIG_FILE) && defined(TIDY_USER_CONFIG_FILE)
    temp_string = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_3A), TIDY_CONFIG_FILE, TIDY_USER_CONFIG_FILE );
    printf( tidyLocalizedString(TC_TXT_HELP_3), temp_string );
    free( temp_string );
#else
    printf( tidyLocalizedString(TC_TXT_HELP_3), "\n" );
#endif
    printf("\n");
}